

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

Function * __thiscall runtime::Heap::NewFunction(Heap *this)

{
  Function *this_00;
  Function *local_18;
  Function *ret;
  Heap *this_local;
  
  ret = (Function *)this;
  this_00 = (Function *)operator_new(0x30);
  (this_00->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::vector
            ((vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_> *)this_00);
  std::shared_ptr<runtime::StackFrame>::shared_ptr(&this_00->scopeOuter);
  this_00->fn = (Function *)0x0;
  local_18 = this_00;
  std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::push_back
            (&this->createdFunctions,&local_18);
  return local_18;
}

Assistant:

runtime::Function* runtime::Heap::NewFunction() noexcept {
  auto ret = new runtime::Function{};
  this->createdFunctions.push_back(ret);
  return ret;
}